

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_parser.c
# Opt level: O2

MPP_RET set_output_frame(Av1CodecContext *ctx)

{
  void *pvVar1;
  uint uVar2;
  MppFrame frame;
  ulong uVar3;
  
  pvVar1 = ctx->priv_data;
  frame = (MppFrame)0x0;
  if (*(int *)((long)pvVar1 + 0x1b98) != 0) {
    uVar2 = mpp_log2(*(int *)((long)pvVar1 + 0x1b98) >> 8);
    uVar3 = (ulong)uVar2;
    if (*(int *)((long)pvVar1 + 0x1884) < (int)uVar2) goto LAB_001b4d2f;
  }
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)((long)pvVar1 + 0x1dba8),*(RK_S32 *)((long)pvVar1 + 0x1870),
             SLOT_FRAME_PTR,&frame);
  if ((*(MppFrameHdrDynamicMeta **)((long)pvVar1 + 0x1b80) != (MppFrameHdrDynamicMeta *)0x0) &&
     (*(int *)((long)pvVar1 + 0x1b88) != 0)) {
    mpp_frame_set_hdr_dynamic_meta(frame,*(MppFrameHdrDynamicMeta **)((long)pvVar1 + 0x1b80));
    *(undefined4 *)((long)pvVar1 + 0x1b88) = 0;
    if (**(char **)((long)pvVar1 + 0x68) != '\0') {
      fill_hdr_meta_to_frame(frame,MPP_VIDEO_CodingAV1);
    }
  }
  mpp_frame_set_pts(frame,*(RK_S64 *)((long)pvVar1 + 0x1dbd8));
  mpp_buf_slot_set_flag
            (*(MppBufSlots *)((long)pvVar1 + 0x1dba8),*(RK_S32 *)((long)pvVar1 + 0x1870),
             SLOT_QUEUE_USE);
  mpp_buf_slot_enqueue
            (*(MppBufSlots *)((long)pvVar1 + 0x1dba8),*(RK_S32 *)((long)pvVar1 + 0x1870),
             QUEUE_DISPLAY);
  uVar3 = *(ulong *)((long)pvVar1 + 7000);
  *(undefined4 *)(uVar3 + 8) = 1;
LAB_001b4d2f:
  return (MPP_RET)uVar3;
}

Assistant:

static MPP_RET set_output_frame(Av1CodecContext *ctx)
{
    AV1Context *s = ctx->priv_data;
    MppFrame frame = NULL;
    MPP_RET ret = MPP_OK;

    // TODO: all layers
    if (s->operating_point_idc &&
        mpp_log2(s->operating_point_idc >> 8) > s->cur_frame.spatial_id)
        return 0;
    mpp_buf_slot_get_prop(s->slots, s->cur_frame.slot_index, SLOT_FRAME_PTR, &frame);
    if (s->hdr_dynamic_meta && s->hdr_dynamic) {
        mpp_frame_set_hdr_dynamic_meta(frame, s->hdr_dynamic_meta);
        s->hdr_dynamic = 0;
        if (s->raw_frame_header->show_existing_frame)
            fill_hdr_meta_to_frame(frame, MPP_VIDEO_CodingAV1);
    }
    mpp_frame_set_pts(frame, s->pts);
    mpp_buf_slot_set_flag(s->slots, s->cur_frame.slot_index, SLOT_QUEUE_USE);
    mpp_buf_slot_enqueue(s->slots, s->cur_frame.slot_index, QUEUE_DISPLAY);
    s->cur_frame.ref->is_output = 1;

    return ret;
}